

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

bool __thiscall
FunctionTable::cInsert
          (FunctionTable *this,TypeNode *returnType,char *lexeme,FormalListNode *varDecl,
          bool pointer)

{
  bool bVar1;
  FunctionSymbol *pFVar2;
  
  pFVar2 = cSearch(this,lexeme);
  if (((pFVar2 != (FunctionSymbol *)0x0) &&
      ((this->super_SymbolTable).currentScope <= (pFVar2->super_Symbol).scope)) &&
     (bVar1 = Symbol::isScope(&pFVar2->super_Symbol,(this->super_SymbolTable).currentScopeLexeme),
     bVar1)) {
    return false;
  }
  pFVar2 = (FunctionSymbol *)operator_new(0x50);
  FunctionSymbol::FunctionSymbol
            (pFVar2,0,(this->super_SymbolTable).currentScope,
             (this->super_SymbolTable).currentScopeLexeme,returnType,pointer,varDecl);
  SymbolTable::cInsert(&this->super_SymbolTable,(Symbol *)pFVar2,lexeme);
  return true;
}

Assistant:

bool FunctionTable::cInsert(TypeNode *returnType, const char *lexeme, FormalListNode *varDecl, bool pointer) {
    FunctionSymbol *funcSymbol = cSearch(lexeme);
    if (funcSymbol == NULL || funcSymbol->getScope() < currentScope || !funcSymbol->isScope(currentScopeLexeme)) {
        SymbolTable::cInsert(new FunctionSymbol(0, currentScope, currentScopeLexeme, returnType, pointer, varDecl),
                             lexeme);
        return true;
    }
    return false;
}